

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cc
# Opt level: O0

void ipx::dump<int>(ostream *os,char *name,int value)

{
  ostream *poVar1;
  int in_EDX;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000e8;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [36];
  int local_14;
  
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"info.",&local_79);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  Textline<std::__cxx11::string>(in_stack_000000e8);
  poVar1 = std::operator<<(in_RDI,local_38);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

static void dump(std::ostream& os, const char* name, T value) {
    os << Textline(std::string("info.")+name) << value << '\n';
}